

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall kj::PathPtr::eval(Path *__return_storage_ptr__,PathPtr *this,StringPtr pathText)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  Vector<kj::String> *this_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t in_R8;
  StringPtr path;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr path_02;
  String local_f0;
  String *local_d8;
  String *p;
  String *__end2;
  String *__begin2;
  ArrayPtr<const_kj::String> *__range2;
  char *pcStack_b0;
  undefined1 local_a8 [8];
  Vector<kj::String> newParts;
  Vector<kj::String> local_58;
  StringPtr local_38;
  PathPtr *local_28;
  PathPtr *this_local;
  StringPtr pathText_local;
  
  pathText_local.content.ptr = (char *)pathText.content.size_;
  this_local = (PathPtr *)pathText.content.ptr;
  local_28 = this;
  pathText_local.content.size_ = (size_t)__return_storage_ptr__;
  StringPtr::StringPtr(&local_38,"/");
  bVar1 = StringPtr::startsWith((StringPtr *)&this_local,&local_38);
  if (bVar1) {
    path.content.size_ = extraout_RDX;
    path.content.ptr = pathText_local.content.ptr;
    sVar2 = Path::countParts((Path *)this_local,path);
    Vector<kj::String>::Vector(&local_58,sVar2);
    path_01.content.size_ = in_R8;
    path_01.content.ptr = pathText_local.content.ptr;
    Path::evalImpl(__return_storage_ptr__,(Path *)&local_58,(Vector<kj::String> *)this_local,path_01
                  );
    Vector<kj::String>::~Vector(&local_58);
  }
  else {
    sVar2 = ArrayPtr<const_kj::String>::size(&this->parts);
    __range2 = &this_local->parts;
    pcStack_b0 = pathText_local.content.ptr;
    path_00.content.size_ = extraout_RDX_00;
    path_00.content.ptr = pathText_local.content.ptr;
    sVar3 = Path::countParts((Path *)this_local,path_00);
    Vector<kj::String>::Vector((Vector<kj::String> *)local_a8,sVar2 + sVar3);
    __begin2 = (String *)this;
    __end2 = ArrayPtr<const_kj::String>::begin(&this->parts);
    p = ArrayPtr<const_kj::String>::end((ArrayPtr<const_kj::String> *)__begin2);
    for (; __end2 != p; __end2 = __end2 + 1) {
      local_d8 = __end2;
      heapString(&local_f0,__end2);
      Vector<kj::String>::add<kj::String>((Vector<kj::String> *)local_a8,&local_f0);
      String::~String(&local_f0);
    }
    this_00 = mv<kj::Vector<kj::String>>((Vector<kj::String> *)local_a8);
    path_02.content.size_ = in_R8;
    path_02.content.ptr = pathText_local.content.ptr;
    Path::evalImpl(__return_storage_ptr__,(Path *)this_00,(Vector<kj::String> *)this_local,path_02);
    Vector<kj::String>::~Vector((Vector<kj::String> *)local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::eval(StringPtr pathText) const {
  if (pathText.startsWith("/")) {
    // Optimization: avoid copying parts that will just be dropped.
    return Path::evalImpl(Vector<String>(Path::countParts(pathText)), pathText);
  } else {
    Vector<String> newParts(parts.size() + Path::countParts(pathText));
    for (auto& p: parts) newParts.add(heapString(p));
    return Path::evalImpl(kj::mv(newParts), pathText);
  }
}